

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexMin2.c
# Opt level: O3

Gia_Man_t *
Gia_ManCreateUnate(Gia_Man_t *p,Abc_Cex_t *pCex,int iFrame,int nRealPis,int fUseAllObjects)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  Gia_Obj_t *pGVar5;
  uint uVar6;
  uint *pInfo;
  Gia_Man_t *p_00;
  char *pcVar7;
  ulong uVar8;
  Gia_Obj_t *pGVar9;
  Gia_Obj_t *pGVar10;
  Gia_Man_t *pGVar11;
  byte bVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  Vec_Int_t *pVVar17;
  ulong uVar18;
  long lVar19;
  Gia_Obj_t *pGVar20;
  int iVar21;
  ulong uVar22;
  long lVar23;
  bool bVar24;
  
  if ((iFrame < 0) || (pCex->iFrame < iFrame)) {
    __assert_fail("iFrame >= 0 && iFrame <= pCex->iFrame",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexMin2.c"
                  ,0xbc,"Gia_Man_t *Gia_ManCreateUnate(Gia_Man_t *, Abc_Cex_t *, int, int, int)");
  }
  p_00 = Gia_ManStart(1000);
  pcVar7 = (char *)malloc(6);
  builtin_strncpy(pcVar7,"unate",6);
  p_00->pName = pcVar7;
  Gia_ManCleanValue(p);
  uVar16 = p->nRegs;
  uVar8 = (ulong)uVar16;
  if (nRealPis < 0) {
    if (0 < (int)uVar16) {
      iVar15 = 0;
      do {
        iVar14 = p->vCis->nSize;
        uVar16 = (iVar14 - (int)uVar8) + iVar15;
        if (((int)uVar16 < 0) || (iVar14 <= (int)uVar16)) goto LAB_005084c5;
        uVar16 = p->vCis->pArray[uVar16];
        if (((long)(int)uVar16 < 0) || (p->nObjs <= (int)uVar16)) goto LAB_005084a6;
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        pGVar20 = p->pObjs + (int)uVar16;
        if (fUseAllObjects == 0) {
          uVar13 = p->nTtWords * iFrame;
          if (((int)uVar13 < 0) || (p->vTruths->nSize <= (int)uVar13)) goto LAB_005084e4;
          if (((uint)p->vTruths->pArray[(ulong)uVar13 + (ulong)(uVar16 >> 4)] >>
               ((char)uVar16 * '\x02' & 0x1fU) & 2) != 0) {
            pGVar9 = Gia_ManAppendObj(p_00);
            uVar8 = *(ulong *)pGVar9;
            *(ulong *)pGVar9 = uVar8 | 0x9fffffff;
            *(ulong *)pGVar9 =
                 uVar8 & 0xe0000000ffffffff | 0x9fffffff |
                 (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
            pGVar10 = p_00->pObjs;
            if ((pGVar10 <= pGVar9) && (pGVar9 < pGVar10 + p_00->nObjs)) {
              Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar9 - (long)pGVar10) >> 2) * -0x55555555
                         );
              pGVar10 = p_00->pObjs;
              if ((pGVar10 <= pGVar9) && (pGVar9 < pGVar10 + p_00->nObjs)) goto LAB_00507c56;
            }
            goto LAB_00508503;
          }
        }
        else {
          pGVar9 = Gia_ManAppendObj(p_00);
          uVar8 = *(ulong *)pGVar9;
          *(ulong *)pGVar9 = uVar8 | 0x9fffffff;
          *(ulong *)pGVar9 =
               uVar8 & 0xe0000000ffffffff | 0x9fffffff |
               (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
          pGVar10 = p_00->pObjs;
          if ((pGVar9 < pGVar10) || (pGVar10 + p_00->nObjs <= pGVar9)) goto LAB_00508503;
          Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar9 - (long)pGVar10) >> 2) * -0x55555555);
          pGVar10 = p_00->pObjs;
          if ((pGVar9 < pGVar10) ||
             (((pGVar10 + p_00->nObjs <= pGVar9 || (pGVar5 = p->pObjs, pGVar20 < pGVar5)) ||
              (pGVar5 + p->nObjs <= pGVar20)))) goto LAB_00508503;
          uVar16 = p->nTtWords * iFrame;
          if (((int)uVar16 < 0) || (p->vTruths->nSize <= (int)uVar16)) goto LAB_005084e4;
          iVar14 = (int)((ulong)((long)pGVar20 - (long)pGVar5) >> 2) * -0x55555555;
          if (((uint)p->vTruths->pArray[(ulong)uVar16 + (long)(iVar14 >> 4)] >>
               ((char)iVar14 * '\x02' & 0x1fU) & 2) != 0) {
LAB_00507c56:
            pGVar20->Value = (int)((ulong)((long)pGVar9 - (long)pGVar10) >> 2) * 0x55555556;
          }
        }
        iVar15 = iVar15 + 1;
        uVar8 = (ulong)(uint)p->nRegs;
      } while (iVar15 < p->nRegs);
    }
  }
  else if (0 < (int)uVar16) {
    pVVar17 = p->vCis;
    iVar15 = pVVar17->nSize;
    uVar22 = (ulong)(iVar15 - uVar16);
    do {
      if (((int)uVar22 < 0) || (iVar15 <= (int)uVar22)) goto LAB_005084c5;
      uVar16 = pVVar17->pArray[uVar22];
      if (((long)(int)uVar16 < 0) || (p->nObjs <= (int)uVar16)) goto LAB_005084a6;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      uVar13 = p->nTtWords * iFrame;
      if (((int)uVar13 < 0) || (p->vTruths->nSize <= (int)uVar13)) goto LAB_005084e4;
      p->pObjs[(int)uVar16].Value =
           ((uint)p->vTruths->pArray[(ulong)uVar13 + (ulong)(uVar16 >> 4)] >>
           ((char)uVar16 * '\x02' & 0x1fU)) >> 1 & 1;
      uVar22 = uVar22 + 1;
      uVar8 = uVar8 - 1;
    } while (uVar8 != 0);
  }
  Gia_ManHashAlloc(p_00);
  if (pCex->iFrame < iFrame) {
LAB_0050827e:
    Gia_ManHashStop(p_00);
    uVar16 = pCex->iPo;
    iVar15 = p->vCos->nSize;
    if (iVar15 - p->nRegs <= (int)uVar16) {
      __assert_fail("v < Gia_ManPoNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                    ,0x1a7,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
    }
    if (((int)uVar16 < 0) || (iVar15 <= (int)uVar16)) {
LAB_005084c5:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    uVar16 = p->vCos->pArray[uVar16];
    if (((long)(int)uVar16 < 0) || (p->nObjs <= (int)uVar16)) {
LAB_005084a6:
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                    ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    uVar13 = pCex->iFrame * p->nTtWords;
    if (((int)uVar13 < 0) || (p->vTruths->nSize <= (int)uVar13)) {
LAB_005084e4:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x1af,"int *Vec_IntEntryP(Vec_Int_t *, int)");
    }
    if (((uint)p->vTruths->pArray[(ulong)uVar13 + (ulong)(uVar16 >> 4)] >>
         ((char)uVar16 * '\x02' & 0x1fU) & 2) == 0) {
      __assert_fail("(Gia_ManGetTwo(p, pCex->iFrame, pObj) >> 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexMin2.c"
                    ,0x128,"Gia_Man_t *Gia_ManCreateUnate(Gia_Man_t *, Abc_Cex_t *, int, int, int)")
      ;
    }
    uVar16 = p->pObjs[(int)uVar16].Value;
    if (uVar16 == 0) {
      __assert_fail("pObj->Value",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexMin2.c"
                    ,0x129,"Gia_Man_t *Gia_ManCreateUnate(Gia_Man_t *, Abc_Cex_t *, int, int, int)")
      ;
    }
    if (-1 < (int)uVar16) {
      uVar13 = uVar16 >> 1;
      if ((int)uVar13 < p_00->nObjs) {
        if ((~*(uint *)(p_00->pObjs + uVar13) & 0x1fffffff) != 0 &&
            (int)*(uint *)(p_00->pObjs + uVar13) < 0) {
          __assert_fail("!Gia_ObjIsCo(Gia_ManObj(p, Abc_Lit2Var(iLit0)))",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                        ,0x2d7,"int Gia_ManAppendCo(Gia_Man_t *, int)");
        }
        pGVar10 = Gia_ManAppendObj(p_00);
        uVar8 = *(ulong *)pGVar10;
        *(ulong *)pGVar10 = uVar8 | 0x80000000;
        pGVar20 = p_00->pObjs;
        if ((pGVar20 <= pGVar10) && (pGVar10 < pGVar20 + p_00->nObjs)) {
          uVar22 = (ulong)(((uint)((int)pGVar10 - (int)pGVar20) >> 2) * -0x55555555 - uVar13 &
                          0x1fffffff);
          uVar18 = (ulong)((uVar16 & 1) << 0x1d);
          *(ulong *)pGVar10 = uVar18 | uVar8 & 0xffffffffc0000000 | 0x80000000 | uVar22;
          *(ulong *)pGVar10 =
               uVar18 | uVar8 & 0xe0000000c0000000 | 0x80000000 | uVar22 |
               (ulong)(p_00->vCos->nSize & 0x1fffffff) << 0x20;
          pGVar20 = p_00->pObjs;
          if ((pGVar20 <= pGVar10) && (pGVar10 < pGVar20 + p_00->nObjs)) {
            Vec_IntPush(p_00->vCos,(int)((ulong)((long)pGVar10 - (long)pGVar20) >> 2) * -0x55555555)
            ;
            if (p_00->pFanData != (int *)0x0) {
              Gia_ObjAddFanout(p_00,pGVar10 + -(ulong)((uint)*(undefined8 *)pGVar10 & 0x1fffffff),
                               pGVar10);
            }
            if ((p_00->pObjs <= pGVar10) && (pGVar10 < p_00->pObjs + p_00->nObjs)) {
              pGVar11 = Gia_ManCleanup(p_00);
              Gia_ManStop(p_00);
              return pGVar11;
            }
          }
        }
        goto LAB_00508503;
      }
    }
    __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                  ,0x2d6,"int Gia_ManAppendCo(Gia_Man_t *, int)");
  }
  uVar8 = (ulong)(uint)p->nObjs;
  while (0 < (int)(uint)uVar8) {
    uVar16 = p->nTtWords * iFrame;
    if (((int)uVar16 < 0) || (p->vTruths->nSize <= (int)uVar16)) goto LAB_005084e4;
    pGVar20 = p->pObjs;
    piVar4 = p->vTruths->pArray;
    pGVar20->Value = (uint)piVar4[uVar16] >> 1 & 1;
    iVar15 = p->nRegs;
    pVVar17 = p->vCis;
    uVar13 = pVVar17->nSize;
    uVar22 = (ulong)uVar13;
    if (nRealPis < 0) {
      if (uVar13 - iVar15 != 0 && iVar15 <= (int)uVar13) {
        uVar1 = uVar13;
        if ((int)uVar13 < 1) {
          uVar1 = 0;
        }
        uVar22 = 0;
        do {
          if (uVar1 == uVar22) goto LAB_005084c5;
          uVar6 = pVVar17->pArray[uVar22];
          if ((uint)uVar8 <= uVar6) goto LAB_005084a6;
          pGVar20[uVar6].Value =
               ((uint)piVar4[(ulong)uVar16 + (long)((int)uVar6 >> 4)] >>
               ((char)uVar6 * '\x02' & 0x1fU)) >> 1 & 1;
          uVar22 = uVar22 + 1;
        } while (uVar13 - iVar15 != uVar22);
        goto LAB_00508021;
      }
LAB_00508029:
      pGVar20 = p->pObjs;
      if (pGVar20 != (Gia_Obj_t *)0x0) {
        lVar23 = 1;
        bVar12 = 0;
        lVar19 = 0;
        do {
          uVar8 = *(ulong *)pGVar20;
          if ((uVar8 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar8) {
            pGVar20->Value = 0;
            uVar16 = p->nTtWords * iFrame;
            if (((int)uVar16 < 0) || (p->vTruths->nSize <= (int)uVar16)) goto LAB_005084e4;
            uVar16 = (uint)p->vTruths->pArray[(ulong)uVar16 + (lVar23 - 1U >> 4 & 0xfffffff)] >>
                     (bVar12 & 0x1e);
            if ((uVar16 & 2) != 0) {
              uVar13 = pGVar20[-(uVar8 & 0x1fffffff)].Value;
              uVar1 = pGVar20[-(ulong)((uint)(uVar8 >> 0x20) & 0x1fffffff)].Value;
              if (uVar13 == 0) {
                uVar6 = uVar1;
                if (uVar1 == 0) {
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexMin2.c"
                                ,0x11c,
                                "Gia_Man_t *Gia_ManCreateUnate(Gia_Man_t *, Abc_Cex_t *, int, int, int)"
                               );
                }
              }
              else {
                uVar6 = uVar13;
                if (uVar1 != 0) {
                  bVar24 = uVar13 == 1;
                  if (bVar24) {
                    uVar6 = uVar1;
                  }
                  if ((uVar16 & 1) == 0) {
                    if (!bVar24 && uVar1 != 1) {
                      uVar6 = Gia_ManHashOr(p_00,uVar13,uVar1);
                    }
                  }
                  else if (!bVar24 && uVar1 != 1) {
                    uVar6 = Gia_ManHashAnd(p_00,uVar13,uVar1);
                  }
                }
              }
              pGVar20->Value = uVar6;
            }
          }
          uVar8 = (ulong)p->nObjs;
          if ((long)uVar8 <= lVar23) break;
          lVar19 = lVar19 + 1;
          pGVar20 = p->pObjs + lVar19;
          lVar23 = lVar23 + 1;
          bVar12 = bVar12 + 2;
        } while (p->pObjs != (Gia_Obj_t *)0x0);
      }
    }
    else {
      if ((int)uVar13 <= iVar15) goto LAB_00508029;
      lVar19 = 0;
      do {
        if ((int)uVar22 <= lVar19) goto LAB_005084c5;
        uVar16 = pVVar17->pArray[lVar19];
        if (((long)(int)uVar16 < 0) || (uVar8 = (ulong)(uint)p->nObjs, p->nObjs <= (int)uVar16))
        goto LAB_005084a6;
        if (p->pObjs == (Gia_Obj_t *)0x0) goto LAB_00508029;
        uVar13 = p->nTtWords * iFrame;
        if (((int)uVar13 < 0) || (p->vTruths->nSize <= (int)uVar13)) goto LAB_005084e4;
        pGVar20 = p->pObjs + (int)uVar16;
        piVar4 = p->vTruths->pArray;
        bVar12 = (char)uVar16 * '\x02' & 0x1e;
        pGVar20->Value = ((uint)piVar4[(ulong)uVar13 + (ulong)(uVar16 >> 4)] >> bVar12) >> 1 & 1;
        if (nRealPis <= lVar19) {
          if (fUseAllObjects == 0) {
            if (((uint)piVar4[(ulong)uVar13 + (ulong)(uVar16 >> 4)] >> bVar12 & 2) != 0) {
              pGVar9 = Gia_ManAppendObj(p_00);
              uVar8 = *(ulong *)pGVar9;
              *(ulong *)pGVar9 = uVar8 | 0x9fffffff;
              *(ulong *)pGVar9 =
                   uVar8 & 0xe0000000ffffffff | 0x9fffffff |
                   (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
              pGVar10 = p_00->pObjs;
              if ((pGVar10 <= pGVar9) && (pGVar9 < pGVar10 + p_00->nObjs)) {
                Vec_IntPush(p_00->vCis,
                            (int)((ulong)((long)pGVar9 - (long)pGVar10) >> 2) * -0x55555555);
                pGVar10 = p_00->pObjs;
                if ((pGVar10 <= pGVar9) && (pGVar9 < pGVar10 + p_00->nObjs)) {
                  uVar8 = (long)pGVar9 - (long)pGVar10;
                  goto LAB_00507f84;
                }
              }
              goto LAB_00508503;
            }
          }
          else {
            pGVar9 = Gia_ManAppendObj(p_00);
            uVar8 = *(ulong *)pGVar9;
            *(ulong *)pGVar9 = uVar8 | 0x9fffffff;
            *(ulong *)pGVar9 =
                 uVar8 & 0xe0000000ffffffff | 0x9fffffff |
                 (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
            pGVar10 = p_00->pObjs;
            if ((pGVar9 < pGVar10) || (pGVar10 + p_00->nObjs <= pGVar9)) goto LAB_00508503;
            Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar9 - (long)pGVar10) >> 2) * -0x55555555);
            pGVar10 = p_00->pObjs;
            if ((pGVar9 < pGVar10) ||
               (((pGVar10 + p_00->nObjs <= pGVar9 || (pGVar5 = p->pObjs, pGVar20 < pGVar5)) ||
                (pGVar5 + p->nObjs <= pGVar20)))) goto LAB_00508503;
            uVar16 = p->nTtWords * iFrame;
            if (((int)uVar16 < 0) || (p->vTruths->nSize <= (int)uVar16)) goto LAB_005084e4;
            iVar15 = (int)((ulong)((long)pGVar20 - (long)pGVar5) >> 2) * -0x55555555;
            if (((uint)p->vTruths->pArray[(ulong)uVar16 + (long)(iVar15 >> 4)] >>
                 ((char)iVar15 * '\x02' & 0x1fU) & 2) != 0) {
              uVar8 = (long)pGVar9 - (long)pGVar10;
LAB_00507f84:
              pGVar20->Value = (int)(uVar8 >> 2) * 0x55555556;
            }
          }
        }
        lVar19 = lVar19 + 1;
        pVVar17 = p->vCis;
        uVar22 = (ulong)pVVar17->nSize;
      } while (lVar19 < (long)(uVar22 - (long)p->nRegs));
      uVar8 = (ulong)(uint)p->nObjs;
LAB_00508021:
      if (0 < (int)uVar8) goto LAB_00508029;
    }
    pVVar17 = p->vCos;
    iVar15 = pVVar17->nSize;
    uVar16 = (uint)uVar8;
    if (0 < (long)iVar15) {
      piVar4 = pVVar17->pArray;
      lVar19 = 0;
      do {
        iVar14 = piVar4[lVar19];
        if (((long)iVar14 < 0) || ((int)uVar16 <= iVar14)) goto LAB_005084a6;
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        pGVar20 = p->pObjs + iVar14;
        pGVar20->Value = pGVar20[-(ulong)((uint)*(undefined8 *)pGVar20 & 0x1fffffff)].Value;
        lVar19 = lVar19 + 1;
      } while (iVar15 != lVar19);
    }
    iVar14 = pCex->iFrame;
    if (iFrame == iVar14) goto LAB_0050827e;
    iVar21 = p->nRegs;
    lVar19 = (long)iVar21;
    if (0 < lVar19) {
      uVar22 = (ulong)(uint)(iVar15 - iVar21);
      iVar21 = -iVar21;
      do {
        if ((iVar15 + iVar21 < 0) || (iVar15 <= iVar15 + iVar21)) goto LAB_005084c5;
        iVar2 = pVVar17->pArray[uVar22];
        if (((long)iVar2 < 0) || ((int)uVar16 <= iVar2)) goto LAB_005084a6;
        pGVar20 = p->pObjs;
        if (pGVar20 == (Gia_Obj_t *)0x0) break;
        iVar3 = p->vCis->nSize;
        uVar13 = iVar21 + iVar3;
        if (((int)uVar13 < 0) || (iVar3 <= (int)uVar13)) goto LAB_005084c5;
        uVar13 = p->vCis->pArray[uVar13];
        if (((long)(int)uVar13 < 0) || (uVar16 <= uVar13)) goto LAB_005084a6;
        pGVar20[(int)uVar13].Value = pGVar20[iVar2].Value;
        iVar21 = iVar21 + 1;
        uVar22 = uVar22 + 1;
        lVar19 = lVar19 + -1;
      } while (lVar19 != 0);
    }
    bVar24 = iVar14 <= iFrame;
    iFrame = iFrame + 1;
    if (bVar24) goto LAB_0050827e;
  }
LAB_00508503:
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

Gia_Man_t * Gia_ManCreateUnate( Gia_Man_t * p, Abc_Cex_t * pCex, int iFrame, int nRealPis, int fUseAllObjects )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj, * pObjRo, * pObjRi;
    int f, k, Value;
    assert( iFrame >= 0 && iFrame <= pCex->iFrame );
    pNew = Gia_ManStart( 1000 );
    pNew->pName = Abc_UtilStrsav( "unate" );
    Gia_ManCleanValue( p );
    // set flop outputs
    if ( nRealPis < 0 ) // CEX min
    {
        Gia_ManForEachRo( p, pObj, k )
        {
            if ( fUseAllObjects )
            {
                int Value = Gia_ManAppendCi(pNew);
                if ( (Gia_ManGetTwo(p, iFrame, pObj) >> 1) ) // in the path
                    pObj->Value = Value;
            }
            else if ( (Gia_ManGetTwo(p, iFrame, pObj) >> 1) ) // in the path
                pObj->Value = Gia_ManAppendCi(pNew);
        }
    }
    else
    {
        Gia_ManForEachRo( p, pObj, k )
            pObj->Value = (Gia_ManGetTwo(p, iFrame, pObj) >> 1);
    }
    Gia_ManHashAlloc( pNew );
    for ( f = iFrame; f <= pCex->iFrame; f++ )
    {
/*
        printf( "  F%03d ", f );
        Gia_ManForEachRo( p, pObj, k )
            printf( "%d", pObj->Value > 0 );
        printf( "\n" );
*/
        // set const0 to const1 if present
        pObj = Gia_ManConst0(p);
        pObj->Value = (Gia_ManGetTwo(p, f, pObj) >> 1);
        // set primary inputs 
        if ( nRealPis < 0 ) // CEX min
        {
            Gia_ManForEachPi( p, pObj, k )
                pObj->Value = (Gia_ManGetTwo(p, f, pObj) >> 1);
        }
        else
        {
            Gia_ManForEachPi( p, pObj, k )
            {
                pObj->Value = (Gia_ManGetTwo(p, f, pObj) >> 1);
                if ( k >= nRealPis )
                {
                    if ( fUseAllObjects )
                    {
                        int Value = Gia_ManAppendCi(pNew);
                        if ( (Gia_ManGetTwo(p, f, pObj) >> 1) ) // in the path
                            pObj->Value = Value;
                    }
                    else if ( (Gia_ManGetTwo(p, f, pObj) >> 1) ) // in the path
                        pObj->Value = Gia_ManAppendCi(pNew);
                }
            }
        }
        // traverse internal nodes
        Gia_ManForEachAnd( p, pObj, k )
        { 
            pObj->Value = 0;
            Value = Gia_ManGetTwo(p, f, pObj);
            if ( !(Value >> 1) ) // not in the path
                continue;
            if ( Gia_ObjFanin0(pObj)->Value && Gia_ObjFanin1(pObj)->Value )
            {
                if ( 1 & Gia_ManGetTwo(p, f, pObj) ) // value 1
                {
                    if ( Gia_ObjFanin0(pObj)->Value > 1 && Gia_ObjFanin1(pObj)->Value > 1 )
                        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0(pObj)->Value, Gia_ObjFanin1(pObj)->Value );
                    else if ( Gia_ObjFanin0(pObj)->Value > 1 )
                        pObj->Value = Gia_ObjFanin0(pObj)->Value;
                    else if ( Gia_ObjFanin1(pObj)->Value > 1 )
                        pObj->Value = Gia_ObjFanin1(pObj)->Value;
                    else 
                        pObj->Value = 1;
                }
                else // value 0
                {
                    if ( Gia_ObjFanin0(pObj)->Value > 1 && Gia_ObjFanin1(pObj)->Value > 1 )
                        pObj->Value = Gia_ManHashOr( pNew, Gia_ObjFanin0(pObj)->Value, Gia_ObjFanin1(pObj)->Value );
                    else if ( Gia_ObjFanin0(pObj)->Value > 1 )
                        pObj->Value = Gia_ObjFanin0(pObj)->Value;
                    else if ( Gia_ObjFanin1(pObj)->Value > 1 )
                        pObj->Value = Gia_ObjFanin1(pObj)->Value;
                    else 
                        pObj->Value = 1;
                }
            }
            else if ( Gia_ObjFanin0(pObj)->Value )
                pObj->Value = Gia_ObjFanin0(pObj)->Value;
            else if ( Gia_ObjFanin1(pObj)->Value )
                pObj->Value = Gia_ObjFanin1(pObj)->Value;
            else assert( 0 );
        }
        Gia_ManForEachCo( p, pObj, k )
            pObj->Value = Gia_ObjFanin0(pObj)->Value;
        if ( f == pCex->iFrame )
            break;
        Gia_ManForEachRiRo( p, pObjRi, pObjRo, k )
            pObjRo->Value = pObjRi->Value;
    }
    Gia_ManHashStop( pNew );
    // create primary output
    pObj = Gia_ManPo(p, pCex->iPo);
    assert( (Gia_ManGetTwo(p, pCex->iFrame, pObj) >> 1) );
    assert( pObj->Value );
    Gia_ManAppendCo( pNew, pObj->Value );
    // cleanup
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}